

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnDemoRecSnap(CGameClient *this)

{
  long lVar1;
  int iVar2;
  IClient *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar5;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  CNetObj_De_GameInfo *pGameInfo;
  CNetObj_De_TuneParams *pTuneParams;
  int p;
  CNetObj_De_ClientInfo *pClientInfo;
  int i;
  CTuningParams StandardTuning;
  void *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  int local_a4;
  uint local_94;
  uint *puVar4;
  undefined4 extraout_var_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_94 = 0; (int)local_94 < 0x40; local_94 = local_94 + 1) {
    if ((in_RDI->m_aClients[(int)local_94].m_Active & 1U) != 0) {
      pIVar3 = Client(in_RDI);
      iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x22])(pIVar3,0xd,(ulong)local_94);
      puVar4 = (uint *)CONCAT44(extraout_var,iVar2);
      if (puVar4 == (uint *)0x0) goto LAB_001d0db4;
      *puVar4 = (uint)(local_94 == in_RDI->m_LocalClientID);
      puVar4[1] = in_RDI->m_aClients[(int)local_94].m_Team;
      StrToInts(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                (char *)in_RDI);
      StrToInts(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                (char *)in_RDI);
      puVar4[9] = in_RDI->m_aClients[(int)local_94].m_Country;
      for (local_a4 = 0; local_a4 < 6; local_a4 = local_a4 + 1) {
        StrToInts(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                  (char *)in_RDI);
        puVar4[(long)local_a4 + 0x2e] =
             in_RDI->m_aClients[(int)local_94].m_aUseCustomColors[local_a4];
        puVar4[(long)local_a4 + 0x34] =
             in_RDI->m_aClients[(int)local_94].m_aSkinPartColors[local_a4];
      }
    }
  }
  CTuningParams::CTuningParams((CTuningParams *)in_RDI);
  iVar2 = mem_comp(in_RDI,in_stack_ffffffffffffff38,0);
  if (iVar2 != 0) {
    pIVar3 = Client(in_RDI);
    iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x22])(pIVar3,0xf,0,0x80);
    if (CONCAT44(extraout_var_00,iVar2) == 0) goto LAB_001d0db4;
    mem_copy(in_RDI,in_stack_ffffffffffffff38,0);
  }
  pIVar3 = Client(in_RDI);
  iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x22])(pIVar3,0xe,0,0x14);
  piVar5 = (int *)CONCAT44(extraout_var_01,iVar2);
  if (piVar5 != (int *)0x0) {
    *piVar5 = (in_RDI->m_GameInfo).m_GameFlags;
    piVar5[1] = (in_RDI->m_GameInfo).m_ScoreLimit;
    piVar5[2] = (in_RDI->m_GameInfo).m_TimeLimit;
    piVar5[3] = (in_RDI->m_GameInfo).m_MatchNum;
    piVar5[4] = (in_RDI->m_GameInfo).m_MatchCurrent;
  }
LAB_001d0db4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnDemoRecSnap()
{
	// add client info
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_aClients[i].m_Active)
			continue;

		CNetObj_De_ClientInfo *pClientInfo = static_cast<CNetObj_De_ClientInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_CLIENTINFO, i, sizeof(CNetObj_De_ClientInfo)));
		if(!pClientInfo)
			return;

		pClientInfo->m_Local = i==m_LocalClientID ? 1 : 0;
		pClientInfo->m_Team = m_aClients[i].m_Team;
		StrToInts(pClientInfo->m_aName, 4, m_aClients[i].m_aName);
		StrToInts(pClientInfo->m_aClan, 3, m_aClients[i].m_aClan);
		pClientInfo->m_Country = m_aClients[i].m_Country;

		for(int p = 0; p < NUM_SKINPARTS; p++)
		{
			StrToInts(pClientInfo->m_aaSkinPartNames[p], 6, m_aClients[i].m_aaSkinPartNames[p]);
			pClientInfo->m_aUseCustomColors[p] = m_aClients[i].m_aUseCustomColors[p];
			pClientInfo->m_aSkinPartColors[p] = m_aClients[i].m_aSkinPartColors[p];
		}
	}

	// add tuning
	CTuningParams StandardTuning;
	if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) != 0)
	{
		CNetObj_De_TuneParams *pTuneParams = static_cast<CNetObj_De_TuneParams *>(Client()->SnapNewItem(NETOBJTYPE_DE_TUNEPARAMS, 0, sizeof(CNetObj_De_TuneParams)));
		if(!pTuneParams)
			return;

		mem_copy(pTuneParams->m_aTuneParams, &m_Tuning, sizeof(pTuneParams->m_aTuneParams));
	}

	// add game info
	CNetObj_De_GameInfo *pGameInfo = static_cast<CNetObj_De_GameInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_GAMEINFO, 0, sizeof(CNetObj_De_GameInfo)));
	if(!pGameInfo)
		return;

	pGameInfo->m_GameFlags = m_GameInfo.m_GameFlags;
	pGameInfo->m_ScoreLimit = m_GameInfo.m_ScoreLimit;
	pGameInfo->m_TimeLimit = m_GameInfo.m_TimeLimit;
	pGameInfo->m_MatchNum = m_GameInfo.m_MatchNum;
	pGameInfo->m_MatchCurrent = m_GameInfo.m_MatchCurrent;
}